

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_header_0(archive_read *a,lha *lha)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  time_t tVar8;
  void *pp;
  char *pcVar9;
  uchar sum_calculated;
  uchar headersum;
  wchar_t namelen;
  wchar_t extdsize;
  uchar *p;
  lha *lha_local;
  archive_read *a_local;
  
  pbVar7 = (byte *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
  if (pbVar7 == (byte *)0x0) {
    a_local._4_4_ = truncated_error(a);
  }
  else {
    lha->header_size = (long)(int)(*pbVar7 + 2);
    bVar1 = pbVar7[1];
    uVar4 = archive_le32dec(pbVar7 + 7);
    lha->compsize = (ulong)uVar4;
    uVar4 = archive_le32dec(pbVar7 + 0xb);
    lha->origsize = (ulong)uVar4;
    tVar8 = lha_dos_time(pbVar7 + 0xf);
    lha->mtime = tVar8;
    uVar5 = (uint)pbVar7[0x15];
    iVar6 = ((int)lha->header_size + -0x18) - uVar5;
    if (((uVar5 < 0xde) && (-1 < iVar6)) || (iVar6 == -2)) {
      pp = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
      if (pp == (void *)0x0) {
        a_local._4_4_ = truncated_error(a);
      }
      else {
        (lha->filename).length = 0;
        archive_strncat(&lha->filename,(void *)((long)pp + 0x16),(long)(int)uVar5);
        if (-1 < iVar6) {
          uVar3 = archive_le16dec((void *)((long)pp + (long)(int)uVar5 + 0x16));
          lha->crc = uVar3;
          lha->setflag = lha->setflag | 8;
        }
        bVar2 = lha_calcsum('\0',pp,L'\x02',lha->header_size - 2);
        if (((0 < iVar6) &&
            (pcVar9 = (char *)((long)pp + (long)(int)(uVar5 + 0x18)), *pcVar9 == 'U')) &&
           (iVar6 == 0xc)) {
          uVar4 = archive_le32dec(pcVar9 + 2);
          lha->mtime = (ulong)uVar4;
          uVar3 = archive_le16dec(pcVar9 + 6);
          lha->mode = (uint)uVar3;
          uVar3 = archive_le16dec(pcVar9 + 8);
          lha->uid = (ulong)uVar3;
          uVar3 = archive_le16dec(pcVar9 + 10);
          lha->gid = (ulong)uVar3;
          lha->setflag = lha->setflag | 4;
        }
        __archive_read_consume(a,lha->header_size);
        if (bVar2 == bVar1) {
          a_local._4_4_ = L'\0';
        }
        else {
          archive_set_error(&a->archive,-1,"LHa header sum error");
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
    else {
      archive_set_error(&a->archive,0x54,"Invalid LHa header");
      a_local._4_4_ = L'\xffffffe2';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
lha_read_file_header_0(struct archive_read *a, struct lha *lha)
{
	const unsigned char *p;
	int extdsize, namelen;
	unsigned char headersum, sum_calculated;

	if ((p = __archive_read_ahead(a, H0_FIXED_SIZE, NULL)) == NULL)
		return (truncated_error(a));
	lha->header_size = p[H0_HEADER_SIZE_OFFSET] + 2;
	headersum = p[H0_HEADER_SUM_OFFSET];
	lha->compsize = archive_le32dec(p + H0_COMP_SIZE_OFFSET);
	lha->origsize = archive_le32dec(p + H0_ORIG_SIZE_OFFSET);
	lha->mtime = lha_dos_time(p + H0_DOS_TIME_OFFSET);
	namelen = p[H0_NAME_LEN_OFFSET];
	extdsize = (int)lha->header_size - H0_FIXED_SIZE - namelen;
	if ((namelen > 221 || extdsize < 0) && extdsize != -2) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa header");
		return (ARCHIVE_FATAL);
	}
	if ((p = __archive_read_ahead(a, lha->header_size, NULL)) == NULL)
		return (truncated_error(a));

	archive_strncpy(&lha->filename, p + H0_FILE_NAME_OFFSET, namelen);
	/* When extdsize == -2, A CRC16 value is not present in the header. */
	if (extdsize >= 0) {
		lha->crc = archive_le16dec(p + H0_FILE_NAME_OFFSET + namelen);
		lha->setflag |= CRC_IS_SET;
	}
	sum_calculated = lha_calcsum(0, p, 2, lha->header_size - 2);

	/* Read an extended header */
	if (extdsize > 0) {
		/* This extended data is set by 'LHa for UNIX' only.
		 * Maybe fixed size.
		 */
		p += H0_FILE_NAME_OFFSET + namelen + 2;
		if (p[0] == 'U' && extdsize == 12) {
			/* p[1] is a minor version. */
			lha->mtime = archive_le32dec(&p[2]);
			lha->mode = archive_le16dec(&p[6]);
			lha->uid = archive_le16dec(&p[8]);
			lha->gid = archive_le16dec(&p[10]);
			lha->setflag |= UNIX_MODE_IS_SET;
		}
	}
	__archive_read_consume(a, lha->header_size);

	if (sum_calculated != headersum) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "LHa header sum error");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
}